

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

Var Js::JavascriptConversion::ToPropertyKey
              (Var argument,ScriptContext *scriptContext,PropertyRecord **propertyRecord,
              PropertyString **propString)

{
  bool bVar1;
  JavascriptSymbol *this;
  PropertyRecord *pPVar2;
  JavascriptString *propName;
  PropertyString *propertyString;
  Var key;
  PropertyString **propString_local;
  PropertyRecord **propertyRecord_local;
  ScriptContext *scriptContext_local;
  Var argument_local;
  
  propertyString = (PropertyString *)ToPrimitive<(Js::JavascriptHint)1>(argument,scriptContext);
  propName = (JavascriptString *)0x0;
  bVar1 = VarIs<Js::JavascriptSymbol>(propertyString);
  if (bVar1) {
    this = UnsafeVarTo<Js::JavascriptSymbol>(propertyString);
    pPVar2 = JavascriptSymbol::GetValue(this);
    *propertyRecord = pPVar2;
  }
  else {
    propertyString = (PropertyString *)ToString(propertyString,scriptContext);
    (*(propertyString->super_JavascriptString).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])
              (propertyString,propertyRecord,0);
    bVar1 = VarIs<Js::PropertyString,Js::JavascriptString>((JavascriptString *)propertyString);
    if (bVar1) {
      propName = &UnsafeVarTo<Js::PropertyString,Js::JavascriptString>
                            ((JavascriptString *)propertyString)->super_JavascriptString;
    }
  }
  if (propString != (PropertyString **)0x0) {
    *propString = (PropertyString *)propName;
  }
  return propertyString;
}

Assistant:

Var JavascriptConversion::ToPropertyKey(
        Var argument,
        _In_ ScriptContext* scriptContext,
        _Out_ const PropertyRecord** propertyRecord,
        _Out_opt_ PropertyString** propString)
    {
        Var key = JavascriptConversion::ToPrimitive<JavascriptHint::HintString>(argument, scriptContext);
        PropertyString * propertyString = nullptr;
        if (VarIs<JavascriptSymbol>(key))
        {
            // If we are looking up a property keyed by a symbol, we already have the PropertyId in the symbol
            *propertyRecord = UnsafeVarTo<JavascriptSymbol>(key)->GetValue();
        }
        else
        {
            // For all other types, convert the key into a string and use that as the property name
            JavascriptString * propName = JavascriptConversion::ToString(key, scriptContext);
            propName->GetPropertyRecord(propertyRecord);
            if (VarIs<PropertyString>(propName))
            {
                propertyString = UnsafeVarTo<PropertyString>(propName);
            }
            key = propName;
        }

        if (propString)
        {
            *propString = propertyString;
        }

        return key;
    }